

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_residual_test.c
# Opt level: O3

void __thiscall lu_residual_test(void *this,lu_int *Bbegin,lu_int *Bend,lu_int *Bi,double *Bx)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  void *__s;
  long lVar13;
  bool bVar14;
  lu_int i_1;
  ulong uVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  uint uVar23;
  long lVar24;
  double dVar25;
  double dVar26;
  double d;
  double dVar27;
  double d_1;
  double local_78;
  uint local_6c;
  double local_58;
  
  iVar2 = *(int *)((long)this + 0x54);
  lVar17 = (long)iVar2;
  iVar3 = *(int *)((long)this + 0x13c);
  lVar22 = (long)iVar3;
  lVar16 = *(long *)((long)this + 0x250);
  lVar6 = *(long *)((long)this + 0x1d8);
  lVar7 = *(long *)((long)this + 0x1e8);
  lVar21 = *(long *)((long)this + 0x278);
  lVar20 = *(long *)((long)this + 0x280);
  lVar8 = *(long *)((long)this + 0x2b0);
  lVar9 = *(long *)((long)this + 0x1a0);
  lVar10 = *(long *)((long)this + 0x1a8);
  lVar11 = *(long *)((long)this + 0x1b8);
  lVar12 = *(long *)((long)this + 0x1c0);
  __s = *(void **)((long)this + 0x298);
  lVar13 = *(long *)((long)this + 0x2a0);
  if (0 < lVar17) {
    lVar19 = *(long *)((long)this + 0x240);
    lVar18 = 0;
    do {
      lVar24 = (long)*(int *)(lVar19 + lVar18 * 4);
      uVar23 = *(uint *)(lVar9 + lVar24 * 4);
      dVar25 = 0.0;
      if (-1 < (int)uVar23) {
        lVar24 = lVar24 << 2;
        do {
          dVar25 = dVar25 + *(double *)(lVar13 + (ulong)uVar23 * 8) *
                            *(double *)(lVar11 + lVar24 * 2);
          uVar23 = *(uint *)(lVar9 + 4 + lVar24);
          lVar24 = lVar24 + 4;
        } while (-1 < (int)uVar23);
      }
      lVar24 = (long)*(int *)(lVar16 + lVar18 * 4);
      dVar27 = *(double *)(&DAT_003be0c0 + (ulong)(dVar25 <= 0.0) * 8);
      *(double *)((long)__s + lVar24 * 8) = dVar27;
      *(double *)(lVar13 + lVar24 * 8) = dVar27 - dVar25;
      lVar18 = lVar18 + 1;
    } while (lVar18 != lVar17);
    if (0 < iVar2) {
      uVar15 = (ulong)(iVar2 - 1);
      do {
        lVar19 = (long)*(int *)(lVar7 + uVar15 * 4);
        dVar25 = *(double *)(lVar13 + lVar19 * 8) / *(double *)(lVar8 + lVar19 * 8);
        *(double *)(lVar13 + lVar19 * 8) = dVar25;
        lVar19 = (long)*(int *)(lVar20 + lVar19 * 4);
        uVar23 = *(uint *)(lVar10 + lVar19 * 4);
        if (-1 < (int)uVar23) {
          lVar19 = lVar19 << 2;
          do {
            *(double *)(lVar13 + (ulong)uVar23 * 8) =
                 *(double *)(lVar12 + lVar19 * 2) * -dVar25 +
                 *(double *)(lVar13 + (ulong)uVar23 * 8);
            uVar23 = *(uint *)(lVar10 + 4 + lVar19);
            lVar19 = lVar19 + 4;
          } while (-1 < (int)uVar23);
        }
        bVar14 = 0 < (long)uVar15;
        uVar15 = uVar15 - 1;
      } while (bVar14);
    }
  }
  local_6c = iVar2 - 1;
  if (0 < iVar3) {
    lVar19 = 0;
    do {
      iVar4 = *(int *)(lVar6 + lVar19 * 4);
      lVar18 = (long)Bbegin[iVar4];
      iVar5 = Bend[iVar4];
      if (Bbegin[iVar4] < iVar5) {
        dVar25 = *(double *)(lVar13 + (long)*(int *)(lVar7 + lVar19 * 4) * 8);
        do {
          *(double *)((long)__s + (long)Bi[lVar18] * 8) =
               Bx[lVar18] * -dVar25 + *(double *)((long)__s + (long)Bi[lVar18] * 8);
          lVar18 = lVar18 + 1;
        } while (iVar5 != lVar18);
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 != lVar22);
  }
  lVar19 = lVar22;
  if (iVar3 < iVar2) {
    do {
      lVar18 = (long)*(int *)(lVar7 + lVar19 * 4);
      *(double *)((long)__s + lVar18 * 8) =
           *(double *)((long)__s + lVar18 * 8) - *(double *)(lVar13 + lVar18 * 8);
      lVar19 = lVar19 + 1;
    } while (lVar17 != lVar19);
  }
  dVar25 = 0.0;
  if (iVar2 < 1) {
    dVar27 = 0.0;
  }
  else {
    lVar19 = 0;
    do {
      dVar25 = dVar25 + ABS(*(double *)(lVar13 + lVar19 * 8));
      lVar19 = lVar19 + 1;
    } while (lVar17 != lVar19);
    dVar27 = 0.0;
    lVar19 = 0;
    do {
      dVar27 = dVar27 + ABS(*(double *)((long)__s + lVar19 * 8));
      lVar19 = lVar19 + 1;
    } while (lVar17 != lVar19);
    if (0 < iVar2) {
      lVar19 = 0;
      do {
        lVar18 = (long)*(int *)(lVar7 + lVar19 * 4);
        lVar24 = (long)*(int *)(lVar20 + lVar18 * 4);
        uVar23 = *(uint *)(lVar10 + lVar24 * 4);
        dVar26 = 0.0;
        if (-1 < (int)uVar23) {
          lVar24 = lVar24 << 2;
          do {
            dVar26 = dVar26 + *(double *)(lVar13 + (ulong)uVar23 * 8) *
                              *(double *)(lVar12 + lVar24 * 2);
            uVar23 = *(uint *)(lVar10 + 4 + lVar24);
            lVar24 = lVar24 + 4;
          } while (-1 < (int)uVar23);
        }
        dVar1 = *(double *)(&DAT_003be0c0 + (ulong)(dVar26 <= 0.0) * 8);
        *(double *)((long)__s + lVar18 * 8) = dVar1;
        *(double *)(lVar13 + lVar18 * 8) = (dVar1 - dVar26) / *(double *)(lVar8 + lVar18 * 8);
        lVar19 = lVar19 + 1;
      } while (lVar19 != lVar17);
      if (0 < iVar2) {
        uVar15 = (ulong)local_6c;
        do {
          lVar20 = (long)*(int *)(lVar21 + uVar15 * 4);
          uVar23 = *(uint *)(lVar9 + lVar20 * 4);
          if ((int)uVar23 < 0) {
            dVar26 = 0.0;
          }
          else {
            lVar20 = lVar20 << 2;
            dVar26 = 0.0;
            do {
              dVar26 = dVar26 + *(double *)(lVar13 + (ulong)uVar23 * 8) *
                                *(double *)(lVar11 + lVar20 * 2);
              uVar23 = *(uint *)(lVar9 + 4 + lVar20);
              lVar20 = lVar20 + 4;
            } while (-1 < (int)uVar23);
          }
          lVar20 = (long)*(int *)(lVar16 + uVar15 * 4);
          *(double *)(lVar13 + lVar20 * 8) = *(double *)(lVar13 + lVar20 * 8) - dVar26;
          bVar14 = 0 < (long)uVar15;
          uVar15 = uVar15 - 1;
        } while (bVar14);
      }
    }
  }
  if (0 < iVar3) {
    lVar16 = 0;
    do {
      iVar4 = *(int *)(lVar6 + lVar16 * 4);
      lVar21 = (long)Bbegin[iVar4];
      dVar26 = 0.0;
      if (Bbegin[iVar4] < Bend[iVar4]) {
        do {
          dVar26 = dVar26 + *(double *)(lVar13 + (long)Bi[lVar21] * 8) * Bx[lVar21];
          lVar21 = lVar21 + 1;
        } while (Bend[iVar4] != lVar21);
      }
      lVar21 = (long)*(int *)(lVar7 + lVar16 * 4);
      *(double *)((long)__s + lVar21 * 8) = *(double *)((long)__s + lVar21 * 8) - dVar26;
      lVar16 = lVar16 + 1;
    } while (lVar16 != lVar22);
  }
  if (iVar3 < iVar2) {
    do {
      lVar16 = (long)*(int *)(lVar7 + lVar22 * 4);
      *(double *)((long)__s + lVar16 * 8) =
           *(double *)((long)__s + lVar16 * 8) - *(double *)(lVar13 + lVar16 * 8);
      lVar22 = lVar22 + 1;
    } while (lVar17 != lVar22);
  }
  if (iVar2 < 1) {
    local_78 = 0.0;
    local_58 = 0.0;
  }
  else {
    local_78 = 0.0;
    lVar16 = 0;
    do {
      local_78 = local_78 + ABS(*(double *)(lVar13 + lVar16 * 8));
      lVar16 = lVar16 + 1;
    } while (lVar17 != lVar16);
    local_58 = 0.0;
    lVar16 = 0;
    do {
      local_58 = local_58 + ABS(*(double *)((long)__s + lVar16 * 8));
      lVar16 = lVar16 + 1;
    } while (lVar17 != lVar16);
  }
  lu_matrix_norm(this,Bbegin,Bend,Bi,Bx);
  dVar27 = dVar27 / (dVar25 * *(double *)((long)this + 0x120) + (double)iVar2);
  local_58 = local_58 / (local_78 * *(double *)((long)this + 0x128) + (double)iVar2);
  dVar25 = local_58;
  if (local_58 <= dVar27) {
    dVar25 = dVar27;
  }
  *(ulong *)((long)this + 0x130) =
       ~-(ulong)NAN(dVar27) & (ulong)dVar25 | -(ulong)NAN(dVar27) & (ulong)local_58;
  if (iVar2 < 1) {
    return;
  }
  memset(__s,0,lVar17 << 3);
  return;
}

Assistant:

void lu_residual_test(
    struct lu *this, const lu_int *Bbegin, const lu_int *Bend, const lu_int *Bi,
    const double *Bx)
{
    const lu_int m                  = this->m;
    const lu_int rank               = this->rank;
    const lu_int *p                 = this->p;
    const lu_int *pivotcol          = this->pivotcol;
    const lu_int *pivotrow          = this->pivotrow;
    const lu_int *Lbegin_p          = this->Lbegin_p;
    const lu_int *Ltbegin_p         = this->Ltbegin_p;
    const lu_int *Ubegin            = this->Ubegin;
    const double *row_pivot         = this->row_pivot;
    const lu_int *Lindex            = this->Lindex;
    const double *Lvalue            = this->Lvalue;
    const lu_int *Uindex            = this->Uindex;
    const double *Uvalue            = this->Uvalue;
    double *rhs                     = this->work0;
    double *lhs                     = this->work1;

    lu_int i, k, ipivot, jpivot, pos;
    double norm_ftran, norm_ftran_res, norm_btran, norm_btran_res, d;

    assert(this->nupdate == 0);

    /* --------------------------------- */
    /* Residual Test with Forward System */
    /* --------------------------------- */

    /* Compute lhs = L\rhs and build rhs on-the-fly. */
    for (k = 0; k < m; k++)
    {
        d = 0.0;
        for (pos = Ltbegin_p[k]; (i = Lindex[pos]) >= 0; pos++)
        {
            d += lhs[i] * Lvalue[pos];
        }
        ipivot = p[k];
        rhs[ipivot] = d <= 0.0 ? 1.0 : -1.0;
        lhs[ipivot] = rhs[ipivot] - d;
    }

    /* Overwrite lhs by U\lhs. */
    for (k = m-1; k >= 0; k--)
    {
        ipivot = pivotrow[k];
        d = lhs[ipivot] /= row_pivot[ipivot];
        for (pos = Ubegin[ipivot]; (i = Uindex[pos]) >= 0; pos++)
        {
            lhs[i] -= d * Uvalue[pos];
        }
    }

    /* Overwrite rhs by the residual rhs-B*lhs. */
    for (k = 0; k < rank; k++)
    {
        ipivot = pivotrow[k];
        jpivot = pivotcol[k];
        d = lhs[ipivot];
        for (pos = Bbegin[jpivot]; pos < Bend[jpivot]; pos++)
        {
            rhs[Bi[pos]] -= d * Bx[pos];
        }
    }
    for (k = rank; k < m; k++)
    {
        ipivot = pivotrow[k];
        rhs[ipivot] -= lhs[ipivot];
    }
    norm_ftran = lu_onenorm(m, lhs);
    norm_ftran_res = lu_onenorm(m, rhs);

    /* ---------------------------------- */
    /* Residual Test with Backward System */
    /* ---------------------------------- */

    /* Compute lhs = U'\rhs and build rhs on-the-fly. */
    for (k = 0; k < m; k++)
    {
        ipivot = pivotrow[k];
        d = 0.0;
        for (pos = Ubegin[ipivot]; (i = Uindex[pos]) >= 0; pos++)
        {
            d += lhs[i] * Uvalue[pos];
        }
        rhs[ipivot] = d <= 0.0 ? 1.0 : -1.0;
        lhs[ipivot] = (rhs[ipivot] - d) / row_pivot[ipivot];
    }

    /* Overwrite lhs by L'\lhs. */
    for (k = m-1; k >= 0; k--)
    {
        d = 0.0;
        for (pos = Lbegin_p[k]; (i = Lindex[pos]) >= 0; pos++)
        {
            d += lhs[i] * Lvalue[pos];
        }
        lhs[p[k]] -= d;
    }

    /* Overwrite rhs by the residual rhs-B'*lhs. */
    for (k = 0; k < rank; k++)
    {
        ipivot = pivotrow[k];
        jpivot = pivotcol[k];
        d = 0.0;
        for (pos = Bbegin[jpivot]; pos < Bend[jpivot]; pos++)
        {
            d += lhs[Bi[pos]] * Bx[pos];
        }
        rhs[ipivot] -= d;
    }
    for (k = rank; k < m; k++)
    {
        ipivot = pivotrow[k];
        rhs[ipivot] -= lhs[ipivot];
    }
    norm_btran = lu_onenorm(m, lhs);
    norm_btran_res = lu_onenorm(m, rhs);

    /* -------- */
    /* Finalize */
    /* -------- */

    lu_matrix_norm(this, Bbegin, Bend, Bi, Bx);
    assert(this->onenorm > 0.0);
    assert(this->infnorm > 0.0);
    this->residual_test = fmax(norm_ftran_res / (m + this->onenorm*norm_ftran),
                               norm_btran_res / (m + this->infnorm*norm_btran));

    /* reset workspace */
    for (i = 0; i < m; i++) rhs[i] = 0;
}